

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_file.c
# Opt level: O1

void file_handle_list(t_file_handle *x,t_symbol *s,int argc,t_atom *argv)

{
  int iVar1;
  t_float f;
  
  iVar1 = file_handle_checkopen(x,(char *)0x0);
  if (iVar1 == 0) {
    return;
  }
  if (x->x_fhptr->fh_mode != 0) {
    file_handle_do_write(x,argc,argv);
    return;
  }
  if ((argc == 1) && (argv->a_type == A_FLOAT)) {
    f = atom_getfloat(argv);
    file_handle_do_read(x,f);
    return;
  }
  pd_error(x,"no way to handle \'list\' messages while reading file");
  return;
}

Assistant:

static void file_handle_list(t_file_handle*x, t_symbol*s, int argc, t_atom*argv) {
    (void)s;
    if(!file_handle_checkopen(x, 0))
        return;
    if(x->x_mode) {
            /* write_mode */
        file_handle_do_write(x, argc, argv);
        } else {
            /* read mode */
        if(1==argc && A_FLOAT==argv->a_type) {
            file_handle_do_read(x, atom_getfloat(argv));
        } else {
            pd_error(x, "no way to handle 'list' messages while reading file");
        }
    }
}